

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrubberband.cpp
# Opt level: O0

void __thiscall QRubberBand::changeEvent(QRubberBand *this,QEvent *e)

{
  long lVar1;
  Type TVar2;
  QFlagsStorage<Qt::WindowType> flags;
  QObject *pQVar3;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  WindowType in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  flags.i = (Int)in_RSI;
  QWidget::changeEvent
            (in_RSI,(QEvent *)CONCAT44(in_stack_ffffffffffffffdc.i,in_stack_ffffffffffffffd8));
  TVar2 = QEvent::type((QEvent *)in_RSI);
  if (TVar2 == ParentChange) {
    pQVar3 = QObject::parent((QObject *)0x6782ff);
    if (pQVar3 == (QObject *)0x0) {
      QWidget::windowFlags(in_RDI);
      flags.i = (Int)QFlags<Qt::WindowType>::operator|
                               ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffffcc);
      QWidget::setWindowFlags(in_RDI,(WindowFlags)in_stack_ffffffffffffffdc.i);
    }
    else {
      QWidget::windowFlags(in_RDI);
      flags.i = (Int)QFlags<Qt::WindowType>::operator&
                               ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffffcc);
      QWidget::setWindowFlags(in_RDI,(WindowFlags)flags.i);
    }
  }
  TVar2 = QEvent::type((QEvent *)in_RSI);
  if (TVar2 == ZOrderChange) {
    QWidget::raise(in_RDI,flags.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRubberBand::changeEvent(QEvent *e)
{
    QWidget::changeEvent(e);
    switch (e->type()) {
    case QEvent::ParentChange:
        if (parent()) {
            setWindowFlags(windowFlags() & ~RUBBERBAND_WINDOW_TYPE);
        } else {
            setWindowFlags(windowFlags() | RUBBERBAND_WINDOW_TYPE);
        }
        break;
    default:
        break;
    }

    if (e->type() == QEvent::ZOrderChange)
        raise();
}